

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsAdvancedTestInstance::
StencilParamsAdvancedTestInstance
          (StencilParamsAdvancedTestInstance *this,Context *context,ShaderMap *shaders)

{
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  mapped_type *ppcVar1;
  VkPipelineDepthStencilStateCreateInfo local_3e0;
  deUint32 dStack_378;
  deUint32 dStack_374;
  VkCompareOp VStack_364;
  deUint32 dStack_360;
  deUint32 dStack_358;
  deUint32 dStack_354;
  VkCompareOp VStack_344;
  deUint32 dStack_340;
  VkPipelineDepthStencilStateCreateInfo local_330;
  undefined1 auStack_2c4 [8];
  StencilOpState backState_2;
  StencilOpState frontState_2;
  StencilOpState backState_1;
  StencilOpState frontState_1;
  Vector<float,_4> local_240;
  PositionColorVertex local_230;
  deUint32 local_210;
  Vec4 local_20c;
  Vector<float,_4> local_1fc;
  PositionColorVertex local_1ec;
  deUint32 local_1cc;
  Vec4 local_1c8;
  Vector<float,_4> local_1b8;
  PositionColorVertex local_1a8;
  deUint32 local_188;
  Vec4 local_184;
  Vector<float,_4> local_174;
  PositionColorVertex local_164;
  deUint32 local_144;
  Vec4 local_140;
  Vector<float,_4> local_130;
  PositionColorVertex local_120;
  deUint32 local_100;
  Vec4 local_fc;
  Vector<float,_4> local_ec;
  PositionColorVertex local_dc;
  deUint32 local_bc;
  Vec4 local_b8;
  Vector<float,_4> local_a8;
  PositionColorVertex local_98;
  deUint32 local_78;
  Vec4 local_74;
  Vector<float,_4> local_58;
  PositionColorVertex local_48;
  key_type local_28 [2];
  ShaderMap *local_20;
  ShaderMap *shaders_local;
  Context *context_local;
  StencilParamsAdvancedTestInstance *this_local;
  
  local_28[1] = 0;
  local_20 = shaders;
  shaders_local = (ShaderMap *)context;
  context_local = (Context *)this;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28 + 1);
  vertexShaderName = *ppcVar1;
  local_28[0] = SHADERTYPE_FRAGMENT;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28);
  DepthStencilBaseCase::DepthStencilBaseCase
            (&this->super_DepthStencilBaseCase,context,vertexShaderName,*ppcVar1);
  (this->super_DepthStencilBaseCase).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StencilParamsAdvancedTestInstance_016ac130;
  tcu::Vector<float,_4>::Vector(&local_58,-0.5,0.5,1.0,1.0);
  local_78 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_74);
  PositionColorVertex::PositionColorVertex(&local_48,&local_58,&local_74);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_48);
  tcu::Vector<float,_4>::Vector(&local_a8,0.5,0.5,1.0,1.0);
  local_bc = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_b8);
  PositionColorVertex::PositionColorVertex(&local_98,&local_a8,&local_b8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_98);
  tcu::Vector<float,_4>::Vector(&local_ec,-0.5,-0.5,1.0,1.0);
  local_100 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_fc);
  PositionColorVertex::PositionColorVertex(&local_dc,&local_ec,&local_fc);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_dc);
  tcu::Vector<float,_4>::Vector(&local_130,0.5,-0.5,1.0,1.0);
  local_144 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_140);
  PositionColorVertex::PositionColorVertex(&local_120,&local_130,&local_140);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_120);
  tcu::Vector<float,_4>::Vector(&local_174,-1.0,1.0,1.0,1.0);
  local_188 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_184);
  PositionColorVertex::PositionColorVertex(&local_164,&local_174,&local_184);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_164);
  tcu::Vector<float,_4>::Vector(&local_1b8,1.0,1.0,1.0,1.0);
  local_1cc = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_1c8);
  PositionColorVertex::PositionColorVertex(&local_1a8,&local_1b8,&local_1c8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_1a8);
  tcu::Vector<float,_4>::Vector(&local_1fc,-1.0,-1.0,1.0,1.0);
  local_210 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_20c);
  PositionColorVertex::PositionColorVertex(&local_1ec,&local_1fc,&local_20c);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_1ec);
  tcu::Vector<float,_4>::Vector(&local_240,1.0,-1.0,1.0,1.0);
  frontState_1.super_VkStencilOpState.writeMask = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&frontState_1.super_VkStencilOpState.reference);
  PositionColorVertex::PositionColorVertex
            (&local_230,&local_240,(Vec4 *)&frontState_1.super_VkStencilOpState.reference);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DepthStencilBaseCase).m_data,&local_230);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&backState_1.super_VkStencilOpState.writeMask,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,
             0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&frontState_2.super_VkStencilOpState.writeMask,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,
             0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&backState_2.super_VkStencilOpState.writeMask,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_NOT_EQUAL,0xffffffff,
             0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)auStack_2c4,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_NOT_EQUAL,0xffffffff,0xffffffff,0);
  VStack_344 = frontState_1.super_VkStencilOpState.compareOp;
  dStack_340 = frontState_1.super_VkStencilOpState.compareMask;
  dStack_358 = backState_1.super_VkStencilOpState.writeMask;
  dStack_354 = backState_1.super_VkStencilOpState.reference;
  VStack_364 = backState_1.super_VkStencilOpState.compareOp;
  dStack_360 = backState_1.super_VkStencilOpState.compareMask;
  dStack_378 = frontState_2.super_VkStencilOpState.writeMask;
  dStack_374 = frontState_2.super_VkStencilOpState.reference;
  _front.super_VkStencilOpState.depthFailOp = frontState_1.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.failOp = backState_1.super_VkStencilOpState.writeMask;
  _front.super_VkStencilOpState.passOp = backState_1.super_VkStencilOpState.reference;
  _front.super_VkStencilOpState.compareOp = frontState_1.super_VkStencilOpState.passOp;
  _front.super_VkStencilOpState.compareMask = frontState_1.super_VkStencilOpState.depthFailOp;
  _front.super_VkStencilOpState.writeMask = frontState_1.super_VkStencilOpState.compareOp;
  _front.super_VkStencilOpState.reference = frontState_1.super_VkStencilOpState.compareMask;
  _back.super_VkStencilOpState.depthFailOp = backState_1.super_VkStencilOpState.failOp;
  _back.super_VkStencilOpState.failOp = frontState_2.super_VkStencilOpState.writeMask;
  _back.super_VkStencilOpState.passOp = frontState_2.super_VkStencilOpState.reference;
  _back.super_VkStencilOpState.compareOp = backState_1.super_VkStencilOpState.passOp;
  _back.super_VkStencilOpState.compareMask = backState_1.super_VkStencilOpState.depthFailOp;
  _back.super_VkStencilOpState.writeMask = backState_1.super_VkStencilOpState.compareOp;
  _back.super_VkStencilOpState.reference = backState_1.super_VkStencilOpState.compareMask;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_330,0,0,VK_COMPARE_OP_NEVER,0,1,_front,_back,0.0,1.0);
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.minDepthBounds = local_330.minDepthBounds;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.maxDepthBounds = local_330.maxDepthBounds;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.compareOp = local_330.back.compareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.compareMask = local_330.back.compareMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.writeMask = local_330.back.writeMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.reference = local_330.back.reference;
  *(undefined8 *)
   &(this->super_DepthStencilBaseCase).m_depthStencilState_1.
    super_VkPipelineDepthStencilStateCreateInfo.front.reference = local_330._64_8_;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.passOp = local_330.back.passOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.back.depthFailOp = local_330.back.depthFailOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.depthFailOp = local_330.front.depthFailOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.compareOp = local_330.front.compareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.compareMask = local_330.front.compareMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.writeMask = local_330.front.writeMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.depthBoundsTestEnable =
       local_330.depthBoundsTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.stencilTestEnable = local_330.stencilTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.failOp = local_330.front.failOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.front.passOp = local_330.front.passOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.flags = local_330.flags;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.depthTestEnable = local_330.depthTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.depthWriteEnable = local_330.depthWriteEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.depthCompareOp = local_330.depthCompareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.sType = local_330.sType;
  *(undefined4 *)
   &(this->super_DepthStencilBaseCase).m_depthStencilState_1.
    super_VkPipelineDepthStencilStateCreateInfo.field_0x4 = local_330._4_4_;
  (this->super_DepthStencilBaseCase).m_depthStencilState_1.
  super_VkPipelineDepthStencilStateCreateInfo.pNext = local_330.pNext;
  _front_00.super_VkStencilOpState.depthFailOp = frontState_2.super_VkStencilOpState.failOp;
  _front_00.super_VkStencilOpState.failOp = backState_2.super_VkStencilOpState.writeMask;
  _front_00.super_VkStencilOpState.passOp = backState_2.super_VkStencilOpState.reference;
  _front_00.super_VkStencilOpState.compareOp = frontState_2.super_VkStencilOpState.passOp;
  _front_00.super_VkStencilOpState.compareMask = frontState_2.super_VkStencilOpState.depthFailOp;
  _front_00.super_VkStencilOpState.writeMask = frontState_2.super_VkStencilOpState.compareOp;
  _front_00.super_VkStencilOpState.reference = frontState_2.super_VkStencilOpState.compareMask;
  _back_00.super_VkStencilOpState.depthFailOp = backState_2.super_VkStencilOpState.failOp;
  _back_00.super_VkStencilOpState.failOp = auStack_2c4._0_4_;
  _back_00.super_VkStencilOpState.passOp = auStack_2c4._4_4_;
  _back_00.super_VkStencilOpState.compareOp = backState_2.super_VkStencilOpState.passOp;
  _back_00.super_VkStencilOpState.compareMask = backState_2.super_VkStencilOpState.depthFailOp;
  _back_00.super_VkStencilOpState.writeMask = backState_2.super_VkStencilOpState.compareOp;
  _back_00.super_VkStencilOpState.reference = backState_2.super_VkStencilOpState.compareMask;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_3e0,0,0,VK_COMPARE_OP_NEVER,0,1,_front_00,_back_00,0.0,1.0)
  ;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.minDepthBounds = local_3e0.minDepthBounds;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.maxDepthBounds = local_3e0.maxDepthBounds;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.compareOp = local_3e0.back.compareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.compareMask = local_3e0.back.compareMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.writeMask = local_3e0.back.writeMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.reference = local_3e0.back.reference;
  *(undefined8 *)
   &(this->super_DepthStencilBaseCase).m_depthStencilState_2.
    super_VkPipelineDepthStencilStateCreateInfo.front.reference = local_3e0._64_8_;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.passOp = local_3e0.back.passOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.back.depthFailOp = local_3e0.back.depthFailOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.depthFailOp = local_3e0.front.depthFailOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.compareOp = local_3e0.front.compareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.compareMask = local_3e0.front.compareMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.writeMask = local_3e0.front.writeMask;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.depthBoundsTestEnable =
       local_3e0.depthBoundsTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.stencilTestEnable = local_3e0.stencilTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.failOp = local_3e0.front.failOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.front.passOp = local_3e0.front.passOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.flags = local_3e0.flags;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.depthTestEnable = local_3e0.depthTestEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.depthWriteEnable = local_3e0.depthWriteEnable;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.depthCompareOp = local_3e0.depthCompareOp;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.sType = local_3e0.sType;
  *(undefined4 *)
   &(this->super_DepthStencilBaseCase).m_depthStencilState_2.
    super_VkPipelineDepthStencilStateCreateInfo.field_0x4 = local_3e0._4_4_;
  (this->super_DepthStencilBaseCase).m_depthStencilState_2.
  super_VkPipelineDepthStencilStateCreateInfo.pNext = local_3e0.pNext;
  DepthStencilBaseCase::initialize(&this->super_DepthStencilBaseCase);
  return;
}

Assistant:

StencilParamsAdvancedTestInstance (Context& context, ShaderMap shaders)
		: DepthStencilBaseCase (context, shaders[glu::SHADERTYPE_VERTEX], shaders[glu::SHADERTYPE_FRAGMENT])
	{
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		const PipelineCreateInfo::DepthStencilState::StencilOpState frontState_1 =
			PipelineCreateInfo::DepthStencilState::StencilOpState(
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_COMPARE_OP_ALWAYS);

		const PipelineCreateInfo::DepthStencilState::StencilOpState backState_1 =
			PipelineCreateInfo::DepthStencilState::StencilOpState(
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_COMPARE_OP_ALWAYS);

		const PipelineCreateInfo::DepthStencilState::StencilOpState frontState_2 =
			PipelineCreateInfo::DepthStencilState::StencilOpState(
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_COMPARE_OP_NOT_EQUAL);

		const PipelineCreateInfo::DepthStencilState::StencilOpState backState_2 =
			PipelineCreateInfo::DepthStencilState::StencilOpState(
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_STENCIL_OP_REPLACE,
			vk::VK_COMPARE_OP_NOT_EQUAL);

		// enable stencil test
		m_depthStencilState_1 = PipelineCreateInfo::DepthStencilState(
			VK_FALSE, VK_FALSE, vk::VK_COMPARE_OP_NEVER, VK_FALSE, VK_TRUE, frontState_1, backState_1);

		m_depthStencilState_2 = PipelineCreateInfo::DepthStencilState(
			VK_FALSE, VK_FALSE, vk::VK_COMPARE_OP_NEVER, VK_FALSE, VK_TRUE, frontState_2, backState_2);

		DepthStencilBaseCase::initialize();
	}